

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O2

void DepParserTask::run(search *sch,multi_ex *ec)

{
  v_array<unsigned_int> *valid_action;
  v_array<std::pair<unsigned_int,_float>_> *gold_action_losses;
  v_array<unsigned_int> *gold_actions;
  uint uVar1;
  undefined8 *puVar2;
  bool bVar3;
  uint n;
  ptag pVar4;
  action aVar5;
  uint32_t t_id;
  ptag count;
  ulong uVar6;
  predictor *ppVar7;
  size_t sVar8;
  stringstream *psVar9;
  ostream *poVar10;
  vw_exception *this;
  size_t i;
  long lVar11;
  ulong uVar12;
  uint32_t uVar13;
  uint64_t stack_depth;
  uint64_t state;
  ptag tag;
  uint idx;
  uint32_t right_label;
  uint32_t left_label;
  size_t i_1;
  ulong uVar14;
  float loss;
  uint64_t uStack_320;
  string local_2c0;
  predictor P;
  stringstream __msg;
  ostream local_1a8;
  
  puVar2 = (undefined8 *)sch->task_data;
  uVar6 = (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  v_array<unsigned_int>::clear((v_array<unsigned_int> *)(puVar2 + 0x13));
  if (puVar2[1] == 0) {
    ___msg = (uint)(*(int *)((long)puVar2 + 0x2c4) != 1);
  }
  else {
    ___msg = 1;
  }
  valid_action = (v_array<unsigned_int> *)(puVar2 + 3);
  gold_action_losses = (v_array<std::pair<unsigned_int,_float>_> *)(puVar2 + 0x2f);
  gold_actions = (v_array<unsigned_int> *)(puVar2 + 0x27);
  v_array<unsigned_int>::push_back((v_array<unsigned_int> *)(puVar2 + 0x13),(uint *)&__msg);
  n = (uint)uVar6;
  for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
    for (uVar12 = 0; n + 1 != uVar12; uVar12 = uVar12 + 1) {
      *(undefined4 *)(puVar2[lVar11 * 4 + 0x33] + uVar12 * 4) = 0;
    }
  }
  uVar6 = uVar6 & 0xffffffff;
  for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
    *(undefined4 *)(puVar2[0x17] + 4 + uVar12 * 4) = 9999999;
    *(undefined4 *)(puVar2[0x1b] + 4 + uVar12 * 4) = 9999999;
  }
  sVar8 = 2;
  if (puVar2[1] == 0) {
    sVar8 = (size_t)((*(int *)((long)puVar2 + 0x2c4) != 1) + 1);
  }
  Search::predictor::predictor(&P,sch,0);
  tag = 1;
LAB_00224b9a:
  do {
    uVar12 = sVar8 & 0xffffffff;
    do {
      idx = (uint)sVar8;
      if (*(int *)((long)puVar2 + 0x2c4) == 2) {
        if ((puVar2[0x14] == puVar2[0x13]) && (n < idx)) goto LAB_0022510c;
      }
      else if ((*(int *)((long)puVar2 + 0x2c4) == 1) &&
              (((ulong)(puVar2[0x14] - puVar2[0x13]) < 5 && (n < idx)))) {
        *(undefined4 *)(puVar2[0x17] + (ulong)*(uint *)(puVar2[0x14] + -4) * 4) = 0;
        *(undefined4 *)(puVar2[0x1b] + (ulong)*(uint *)(puVar2[0x14] + -4) * 4) =
             *(undefined4 *)(puVar2 + 1);
        if (*(int *)(puVar2[0xb] + (ulong)*(uint *)(puVar2[0x14] + -4) * 4) ==
            *(int *)(puVar2[0x17] + (ulong)*(uint *)(puVar2[0x14] + -4) * 4)) {
          loss = 0.0;
        }
        else {
          loss = 1.0;
        }
        Search::search::loss(sch,loss);
LAB_0022510c:
        psVar9 = Search::search::output_abi_cxx11_(sch);
        if (*(int *)(psVar9 + *(long *)(*(long *)psVar9 + -0x18) + 0x20) == 0) {
          for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
            psVar9 = Search::search::output_abi_cxx11_(sch);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar9 + 0x10));
            poVar10 = std::operator<<(poVar10,":");
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::endl<char,std::char_traits<char>>(poVar10);
          }
        }
        Search::predictor::~predictor(&P);
        return;
      }
      bVar3 = Search::search::predictNeedsExample(sch);
      if (bVar3) {
        extract_features(sch,idx,ec);
      }
      lVar11 = puVar2[0x14] - puVar2[0x13];
      if (lVar11 == 0) {
        state = 0;
      }
      else {
        state = (uint64_t)*(uint *)(puVar2[0x14] + -4);
      }
      stack_depth = lVar11 >> 2;
      get_valid_actions(sch,valid_action,uVar12,uVar6,stack_depth,state);
      if (*(int *)((long)puVar2 + 0x2c4) == 2) {
        get_eager_action_cost(sch,idx,uVar6);
      }
      else if (*(int *)((long)puVar2 + 0x2c4) == 1) {
        get_hybrid_action_cost(sch,uVar12,uVar6);
      }
      uVar13 = (uint32_t)stack_depth;
      lVar11 = puVar2[0x14];
      if (puVar2[0x13] == lVar11) {
        left_label = 9999999;
      }
      else {
        left_label = *(uint32_t *)(puVar2[0xf] + (ulong)*(uint *)(lVar11 + -4) * 4);
      }
      uVar1 = *(uint *)((long)puVar2 + 0x2c4);
      if (uVar1 == 2) {
        if (n < idx) {
          right_label = *(uint32_t *)(puVar2 + 1);
        }
        else {
          right_label = *(uint32_t *)(puVar2[0xf] + uVar12 * 4);
        }
      }
      else {
        if (uVar1 != 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          std::operator<<(&local_1a8,"unknown transition system");
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search_dep_parser.cc"
                     ,0x285,&local_2c0);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        if (puVar2[0x13] == lVar11) {
          right_label = 9999999;
        }
        else {
          right_label = *(uint32_t *)(puVar2[0xf] + (ulong)*(uint *)(lVar11 + -4) * 4);
        }
      }
      if (*(char *)((long)puVar2 + 0x2c2) == '\x01') {
        if (*(char *)((long)puVar2 + 0x2c1) == '\0') {
          get_gold_actions(sch,idx,(ulong)uVar1,gold_actions);
          convert_to_onelearner_actions
                    (sch,gold_actions,(v_array<unsigned_int> *)(puVar2 + 0x2b),left_label,
                     right_label);
          uVar13 = 9999999;
          convert_to_onelearner_actions
                    (sch,valid_action,(v_array<unsigned_int> *)(puVar2 + 0x23),9999999,9999999);
          ppVar7 = Search::predictor::set_tag(&P,tag);
          ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
          ppVar7 = Search::predictor::set_oracle(ppVar7,(v_array<unsigned_int> *)(puVar2 + 0x2b));
          ppVar7 = Search::predictor::set_allowed(ppVar7,(v_array<unsigned_int> *)(puVar2 + 0x23));
          pVar4 = Search::search::get_history_length(sch);
        }
        else {
          get_cost_to_go_losses(sch,gold_action_losses,left_label,right_label);
          ppVar7 = Search::predictor::set_tag(&P,tag);
          ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
          ppVar7 = Search::predictor::set_allowed(ppVar7,gold_action_losses);
          pVar4 = Search::search::get_history_length(sch);
        }
        ppVar7 = Search::predictor::set_condition_range(ppVar7,tag - 1,pVar4,'p');
        ppVar7 = Search::predictor::set_learner_id(ppVar7,0);
        aVar5 = Search::predictor::predict(ppVar7);
        t_id = 0;
        pVar4 = tag;
        if (aVar5 == 1) {
          uStack_320 = 1;
        }
        else {
          uVar1 = *(uint *)(puVar2 + 2);
          if (aVar5 == uVar1 * 2 + 2) {
            uStack_320 = 4;
          }
          else {
            t_id = aVar5 - 1;
            if ((bool)(~(aVar5 == 0) & t_id <= uVar1)) {
              uStack_320 = 2;
            }
            else {
              t_id = aVar5 + ~uVar1;
              uStack_320 = 3;
            }
          }
        }
      }
      else {
        if (*(char *)((long)puVar2 + 0x2c1) == '\0') {
          get_gold_actions(sch,idx,(ulong)uVar1,gold_actions);
          ppVar7 = Search::predictor::set_tag(&P,tag);
          ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
          ppVar7 = Search::predictor::set_oracle(ppVar7,gold_actions);
          ppVar7 = Search::predictor::set_allowed(ppVar7,valid_action);
          pVar4 = Search::search::get_history_length(sch);
        }
        else {
          get_cost_to_go_losses(sch,gold_action_losses,left_label,right_label);
          ppVar7 = Search::predictor::set_tag(&P,tag);
          ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
          ppVar7 = Search::predictor::set_allowed(ppVar7,gold_action_losses);
          pVar4 = Search::search::get_history_length(sch);
        }
        ppVar7 = Search::predictor::set_condition_range(ppVar7,tag - 1,pVar4,'p');
        ppVar7 = Search::predictor::set_learner_id(ppVar7,0);
        aVar5 = Search::predictor::predict(ppVar7);
        uVar13 = (uint32_t)stack_depth;
        uStack_320 = (uint64_t)aVar5;
        pVar4 = tag + 1;
        t_id = 0;
        if ((aVar5 != 1) && (aVar5 != 4)) {
          if ((!bVar3) && (bVar3 = Search::search::predictNeedsExample(sch), bVar3)) {
            extract_features(sch,idx,ec);
          }
          uVar13 = (uint32_t)stack_depth;
          if (*(char *)((long)puVar2 + 0x2c1) == '\x01') {
            v_array<std::pair<unsigned_int,_float>_>::clear(gold_action_losses);
            for (uVar14 = 1; uVar13 = (uint32_t)stack_depth, uVar14 <= *(uint *)(puVar2 + 2);
                uVar14 = uVar14 + 1) {
              ___msg = (uint)uVar14;
              v_array<std::pair<unsigned_int,_float>_>::push_back
                        (gold_action_losses,(pair<unsigned_int,_float> *)&__msg);
            }
            ppVar7 = Search::predictor::set_tag(&P,pVar4);
            ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
            ppVar7 = Search::predictor::set_allowed(ppVar7,gold_action_losses);
            count = Search::search::get_history_length(sch);
          }
          else {
            ppVar7 = Search::predictor::set_tag(&P,pVar4);
            ppVar7 = Search::predictor::set_input(ppVar7,(example *)*puVar2);
            if (aVar5 == 3) {
              right_label = left_label;
            }
            ppVar7 = Search::predictor::set_oracle(ppVar7,right_label);
            ppVar7 = Search::predictor::erase_alloweds(ppVar7);
            count = Search::search::get_history_length(sch);
          }
          ppVar7 = Search::predictor::set_condition_range(ppVar7,tag,count,'p');
          ppVar7 = Search::predictor::set_learner_id(ppVar7,(ulong)(aVar5 - 1));
          t_id = Search::predictor::predict(ppVar7);
        }
      }
      tag = pVar4 + 1;
      if (*(int *)((long)puVar2 + 0x2c4) == 2) {
        sVar8 = transition_eager(sch,uStack_320,idx,t_id,n);
        goto LAB_00224b9a;
      }
    } while (*(int *)((long)puVar2 + 0x2c4) != 1);
    sVar8 = transition_hybrid(sch,uStack_320,idx,t_id,uVar13);
  } while( true );
}

Assistant:

void run(Search::search &sch, multi_ex &ec)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &stack = data->stack, &gold_heads = data->gold_heads, &valid_actions = data->valid_actions,
                    &heads = data->heads, &gold_tags = data->gold_tags, &tags = data->tags,
                    &valid_action_temp = data->valid_action_temp;
  v_array<uint32_t> &gold_action_temp = data->gold_action_temp;
  v_array<pair<action, float>> &gold_action_losses = data->gold_action_losses;
  v_array<action> &gold_actions = data->gold_actions;
  bool &cost_to_go = data->cost_to_go, &one_learner = data->one_learner;
  uint32_t &num_label = data->num_label;
  uint32_t &sys = data->transition_system;
  uint32_t n = (uint32_t)ec.size();
  uint32_t left_label, right_label;
  stack.clear();
  stack.push_back((data->root_label == 0 && sys == arc_hybrid) ? 0 : 1);
  for (size_t i = 0; i < 6; i++)
    for (size_t j = 0; j < n + 1; j++) data->children[i][j] = 0;
  for (size_t i = 0; i < n; i++)
  {
    heads[i + 1] = my_null;
    tags[i + 1] = my_null;
  }
  ptag count = 1;
  uint32_t idx = ((data->root_label == 0 && sys == arc_hybrid) ? 1 : 2);
  Search::predictor P(sch, (ptag)0);
  while (true)
  {
    if (sys == arc_hybrid && stack.size() <= 1 && idx > n)
      break;
    else if (sys == arc_eager && stack.size() == 0 && idx > n)
      break;
    bool computedFeatures = false;
    if (sch.predictNeedsExample())
    {
      extract_features(sch, idx, ec);
      computedFeatures = true;
    }
    get_valid_actions(sch, valid_actions, idx, n, (uint64_t)stack.size(), stack.empty() ? 0 : stack.last());
    if (sys == arc_hybrid)
      get_hybrid_action_cost(sch, idx, n);
    else if (sys == arc_eager)
      get_eager_action_cost(sch, idx, n);

    // get gold tag labels
    left_label = stack.empty() ? my_null : gold_tags[stack.last()];
    if (sys == arc_hybrid)
      right_label = stack.empty() ? my_null : gold_tags[stack.last()];
    else if (sys == arc_eager)
      right_label = idx <= n ? gold_tags[idx] : (uint32_t)data->root_label;
    else
      THROW("unknown transition system");

    uint32_t a_id = 0, t_id = 0;
    if (one_learner)
    {
      if (cost_to_go)
      {
        get_cost_to_go_losses(sch, gold_action_losses, left_label, right_label);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_allowed(gold_action_losses)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      else
      {
        get_gold_actions(sch, idx, n, gold_actions);
        convert_to_onelearner_actions(sch, gold_actions, gold_action_temp, left_label, right_label);
        convert_to_onelearner_actions(sch, valid_actions, valid_action_temp, my_null, my_null);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_oracle(gold_action_temp)
                   .set_allowed(valid_action_temp)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      if (a_id == SHIFT)
        t_id = 0;
      else if (a_id == 2 * num_label + 2)
      {
        t_id = 0;
        a_id = REDUCE;
      }
      else if (a_id > 1 && a_id - 1 <= num_label)
      {
        t_id = a_id - 1;
        a_id = REDUCE_RIGHT;
      }
      else
      {
        t_id = (uint64_t)a_id - num_label - 1;
        a_id = REDUCE_LEFT;
      }
    }
    else
    {
      if (cost_to_go)
      {
        get_cost_to_go_losses(sch, gold_action_losses, left_label, right_label);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_allowed(gold_action_losses)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }
      else
      {
        get_gold_actions(sch, idx, n, gold_actions);
        a_id = P.set_tag((ptag)count)
                   .set_input(*(data->ex))
                   .set_oracle(gold_actions)
                   .set_allowed(valid_actions)
                   .set_condition_range(count - 1, sch.get_history_length(), 'p')
                   .set_learner_id(0)
                   .predict();
      }

      // Predict the next action {SHIFT, REDUCE_LEFT, REDUCE_RIGHT}
      count++;

      if (a_id != SHIFT && a_id != REDUCE)
      {
        if ((!computedFeatures) && sch.predictNeedsExample())
          extract_features(sch, idx, ec);

        if (cost_to_go)
        {
          gold_action_losses.clear();
          for (size_t i = 1; i <= data->num_label; i++)
            gold_action_losses.push_back(make_pair((action)i, i != (a_id == REDUCE_LEFT ? left_label : right_label)));
          t_id = P.set_tag((ptag)count)
                     .set_input(*(data->ex))
                     .set_allowed(gold_action_losses)
                     .set_condition_range(count - 1, sch.get_history_length(), 'p')
                     .set_learner_id(a_id - 1)
                     .predict();
        }
        else
        {
          t_id = P.set_tag((ptag)count)
                     .set_input(*(data->ex))
                     .set_oracle(a_id == REDUCE_LEFT ? left_label : right_label)
                     .erase_alloweds()
                     .set_condition_range(count - 1, sch.get_history_length(), 'p')
                     .set_learner_id(a_id - 1)
                     .predict();
        }
      }
    }
    count++;
    if (sys == arc_hybrid)
      idx = (uint32_t)transition_hybrid(sch, a_id, idx, t_id, n);
    else if (sys == arc_eager)
      idx = (uint32_t)transition_eager(sch, a_id, idx, t_id, n);
  }
  if (sys == arc_hybrid)
  {
    heads[stack.last()] = 0;
    tags[stack.last()] = (uint32_t)data->root_label;
    sch.loss((gold_heads[stack.last()] != heads[stack.last()]));
  }
  if (sch.output().good())
    for (size_t i = 1; i <= n; i++) sch.output() << (heads[i]) << ":" << tags[i] << endl;
}